

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t * o_xchar(wchar_t oid)

{
  object_kind *poVar1;
  object_kind *kind;
  wchar_t *pwStack_10;
  wchar_t oid_local;
  
  poVar1 = objkind_byid(oid);
  if (poVar1 == (object_kind *)0x0) {
    pwStack_10 = (wchar_t *)0x0;
  }
  else if ((poVar1->flavor == (flavor *)0x0) || ((poVar1->aware & 1U) != 0)) {
    pwStack_10 = kind_x_char + poVar1->kidx;
  }
  else {
    pwStack_10 = flavor_x_char + poVar1->flavor->fidx;
  }
  return pwStack_10;
}

Assistant:

static wchar_t *o_xchar(int oid)
{
	struct object_kind *kind = objkind_byid(oid);
	if (!kind) return 0;

	if (!kind->flavor || kind->aware)
		return &kind_x_char[kind->kidx];
	else
		return &flavor_x_char[kind->flavor->fidx];
}